

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a_local;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_local;
  
  this->depth = a->depth;
  this->width = a->width;
  this->height = a->height;
  this->n = a->n;
  this->pixel = a->pixel;
  this->row = a->row;
  this->img = a->img;
  a->depth = 0;
  a->width = 0;
  a->height = 0;
  a->n = 0;
  a->pixel = (uchar *)0x0;
  a->row = (uchar **)0x0;
  a->img = (uchar ***)0x0;
  return;
}

Assistant:

Image(Image<T> &&a) noexcept
    {
      depth=a.depth;
      width=a.width;
      height=a.height;
      n=a.n;
      pixel=a.pixel;
      row=a.row;
      img=a.img;

      a.depth=0;
      a.width=0;
      a.height=0;
      a.n=0;
      a.pixel=0;
      a.row=0;
      a.img=0;
    }